

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::Generators::GeneratorUntypedBase::~GeneratorUntypedBase(GeneratorUntypedBase *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

GeneratorUntypedBase::~GeneratorUntypedBase() = default;